

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5IterNextScan(Fts5IndexIter *pIndexIter)

{
  int iVar1;
  Fts5Index *in_RDI;
  Fts5SegIter *pSeg;
  Fts5Index *p;
  Fts5Iter *pIter;
  i64 in_stack_ffffffffffffffe0;
  sqlite3_stmt **ppsVar2;
  long lVar3;
  
  lVar3 = *(long *)&in_RDI->nPendingData;
  fts5MultiIterNext(in_RDI,(Fts5Iter *)in_RDI,(int)((ulong)lVar3 >> 0x20),in_stack_ffffffffffffffe0)
  ;
  if (((*(int *)(lVar3 + 0x3c) == 0) &&
      (ppsVar2 = &in_RDI->pIdxDeleter + (ulong)*(ushort *)(in_RDI->pIdxWriter + 4) * 0x10,
      ppsVar2[2] != (sqlite3_stmt *)0x0)) && (*(char *)ppsVar2[0xc] != '0')) {
    fts5DataRelease((Fts5Data *)0x295b3e);
    ppsVar2[2] = (sqlite3_stmt *)0x0;
    in_RDI->field_0x14 = 1;
  }
  iVar1 = fts5IndexReturn(*(Fts5Index **)&in_RDI->nPendingData);
  return iVar1;
}

Assistant:

static int sqlite3Fts5IterNextScan(Fts5IndexIter *pIndexIter){
  Fts5Iter *pIter = (Fts5Iter*)pIndexIter;
  Fts5Index *p = pIter->pIndex;

  assert( pIter->pIndex->rc==SQLITE_OK );

  fts5MultiIterNext(p, pIter, 0, 0);
  if( p->rc==SQLITE_OK ){
    Fts5SegIter *pSeg = &pIter->aSeg[ pIter->aFirst[1].iFirst ];
    if( pSeg->pLeaf && pSeg->term.p[0]!=FTS5_MAIN_PREFIX ){
      fts5DataRelease(pSeg->pLeaf);
      pSeg->pLeaf = 0;
      pIter->base.bEof = 1;
    }
  }

  return fts5IndexReturn(pIter->pIndex);
}